

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.cpp
# Opt level: O2

value * __thiscall
mjs::anon_unknown_46::json_str
          (value *__return_storage_ptr__,anon_unknown_46 *this,stringify_state *state,
          wstring_view key,object_ptr *holder)

{
  wchar_t *pwVar1;
  pointer psVar2;
  pointer pbVar3;
  bool bVar4;
  uint32_t uVar5;
  undefined8 *puVar6;
  gc_heap_ptr_untyped *pgVar7;
  object *poVar8;
  long *plVar9;
  string *psVar10;
  gc_vector<mjs::gc_heap_ptr_untracked<mjs::gc_string,_true>_> *pgVar11;
  gc_table *pgVar12;
  char *pcVar13;
  undefined8 extraout_RDX;
  undefined8 uVar14;
  undefined8 extraout_RDX_00;
  long lVar15;
  gc_heap *pgVar16;
  uint uVar17;
  ulong uVar18;
  vector<mjs::string,_std::allocator<mjs::string>_> *this_00;
  value *this_01;
  pointer psVar19;
  string *s;
  pointer pbVar20;
  double dVar21;
  wstring_view key_00;
  initializer_list<mjs::value> __l;
  initializer_list<mjs::value> __l_00;
  wstring_view wVar22;
  object_ptr o_2;
  undefined1 local_220 [24];
  undefined1 local_208 [8];
  anon_union_32_5_7b1e0779_for_value_3 local_200;
  allocator<wchar_t> local_1d9;
  object_ptr o;
  value to_json_value;
  value local_1a0;
  vector<mjs::string,_std::allocator<mjs::string>_> partial;
  gc_heap_ptr_untyped local_150;
  value v;
  vector<mjs::string,_std::allocator<mjs::string>_> k;
  object_ptr o_1;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_d8;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  partial_1;
  object_ptr to_json;
  wstring_view key_local;
  wstring_view local_70;
  wstring_view local_60;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_50;
  
  key_local._M_str = (wchar_t *)key._M_len;
  pgVar16 = *(gc_heap **)this;
  key_local._M_len = (size_t)state;
  puVar6 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)key._M_str);
  (**(code **)*puVar6)(&v,puVar6,&key_local);
  if (v.type_ == object) {
    pgVar7 = &value::object_value(&v)->super_gc_heap_ptr_untyped;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&o_1.super_gc_heap_ptr_untyped,pgVar7);
    puVar6 = (undefined8 *)gc_heap_ptr_untyped::get(&o_1.super_gc_heap_ptr_untyped);
    o_2.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)0x6;
    o_2.super_gc_heap_ptr_untyped._8_8_ = anon_var_dwarf_ee8fc;
    (**(code **)*puVar6)(&to_json_value,puVar6);
    if (to_json_value.type_ == object) {
      pgVar7 = &value::object_value(&to_json_value)->super_gc_heap_ptr_untyped;
      gc_heap_ptr_untyped::gc_heap_ptr_untyped(&to_json.super_gc_heap_ptr_untyped,pgVar7);
      bVar4 = gc_heap_ptr_untyped::has_type<mjs::function_object>
                        (&to_json.super_gc_heap_ptr_untyped);
      if (bVar4) {
        string::string((string *)&local_d8,pgVar16,&key_local);
        value::value((value *)local_208,(string *)&local_d8);
        __l._M_len = 1;
        __l._M_array = (iterator)local_208;
        std::vector<mjs::value,_std::allocator<mjs::value>_>::vector
                  ((vector<mjs::value,_std::allocator<mjs::value>_> *)&partial,__l,
                   (allocator_type *)&local_50);
        call_function((value *)&o_2,&to_json_value,&v,
                      (vector<mjs::value,_std::allocator<mjs::value>_> *)&partial);
        value::operator=(&v,(value *)&o_2);
        value::~value((value *)&o_2);
        std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector
                  ((vector<mjs::value,_std::allocator<mjs::value>_> *)&partial);
        value::~value((value *)local_208);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_d8);
      }
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&to_json.super_gc_heap_ptr_untyped);
    }
    value::~value(&to_json_value);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&o_1.super_gc_heap_ptr_untyped);
  }
  to_json.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)key_local._M_len;
  to_json.super_gc_heap_ptr_untyped._8_8_ = key_local._M_str;
  if (*(long *)(this + 0x20) != 0) {
    bVar4 = gc_heap_ptr_untyped::has_type<mjs::function_object>
                      ((gc_heap_ptr_untyped *)(this + 0x20));
    if (!bVar4) {
      __assert_fail("replacer_.has_type<function_object>()",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/json_object.cpp"
                    ,0x20f,
                    "void mjs::(anonymous namespace)::stringify_state::call_replacer(value &, const std::wstring_view, const object_ptr &)"
                   );
    }
    value::value((value *)local_208,(object_ptr *)(this + 0x20));
    value::value((value *)&partial,(object_ptr *)key._M_str);
    string::string((string *)&local_d8,*(gc_heap **)this,(wstring_view *)&to_json);
    value::value(&to_json_value,(string *)&local_d8);
    value::value(&local_1a0,&v);
    __l_00._M_len = 2;
    __l_00._M_array = &to_json_value;
    std::vector<mjs::value,_std::allocator<mjs::value>_>::vector
              ((vector<mjs::value,_std::allocator<mjs::value>_> *)&o_1,__l_00,
               (allocator_type *)&local_50);
    call_function((value *)&o_2,(value *)local_208,(value *)&partial,
                  (vector<mjs::value,_std::allocator<mjs::value>_> *)&o_1);
    value::operator=(&v,(value *)&o_2);
    value::~value((value *)&o_2);
    std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector
              ((vector<mjs::value,_std::allocator<mjs::value>_> *)&o_1);
    lVar15 = 0x28;
    do {
      value::~value((value *)((long)&to_json_value.type_ + lVar15));
      lVar15 = lVar15 + -0x28;
    } while (lVar15 != -0x28);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_d8);
    value::~value((value *)&partial);
    value::~value((value *)local_208);
  }
  if (v.type_ == object) {
    pgVar7 = &value::object_value(&v)->super_gc_heap_ptr_untyped;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&o_2.super_gc_heap_ptr_untyped,pgVar7);
    poVar8 = (object *)gc_heap_ptr_untyped::get(&o_2.super_gc_heap_ptr_untyped);
    bVar4 = is_primitive_object(poVar8);
    if (bVar4) {
      plVar9 = (long *)gc_heap_ptr_untyped::get(&o_2.super_gc_heap_ptr_untyped);
      (**(code **)(*plVar9 + 0x20))(&to_json_value,plVar9);
      value::operator=(&v,&to_json_value);
      value::~value(&to_json_value);
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&o_2.super_gc_heap_ptr_untyped);
  }
  switch(v.type_) {
  case undefined:
    value::value(__return_storage_ptr__,(value *)&value::undefined);
    goto LAB_0014185f;
  case null:
    stringify_state::null_str((stringify_state *)&to_json_value);
    value::value(__return_storage_ptr__,(string *)&to_json_value);
    break;
  case boolean:
    bVar4 = value::boolean_value(&v);
    plVar9 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this);
    pcVar13 = "false";
    if (bVar4) {
      pcVar13 = "true";
    }
    (**(code **)(*plVar9 + 0x98))(&to_json_value,plVar9,pcVar13);
    value::value(__return_storage_ptr__,(string *)&to_json_value);
    break;
  case number:
    dVar21 = value::number_value(&v);
    if ((ulong)ABS(dVar21) < 0x7ff0000000000000) {
      dVar21 = value::number_value(&v);
      to_string((mjs *)&to_json_value,pgVar16,dVar21);
      value::value(__return_storage_ptr__,(string *)&to_json_value);
    }
    else {
      stringify_state::null_str((stringify_state *)&to_json_value);
      value::value(__return_storage_ptr__,(string *)&to_json_value);
    }
    break;
  case string:
    psVar10 = value::string_value(&v);
    partial.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
    super__Vector_impl_data._0_16_ = string::view(psVar10);
    (anonymous_namespace)::json_quote_abi_cxx11_
              ((wstring *)&to_json_value,(_anonymous_namespace_ *)&partial,
               partial.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
               super__Vector_impl_data._M_finish);
    local_200._4_4_ = to_json_value._4_4_;
    local_200._0_4_ = to_json_value.type_;
    local_208 = (undefined1  [8])
                to_json_value.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped
                .heap_;
    string::string((string *)&o_2,pgVar16,(wstring_view *)local_208);
    value::value(__return_storage_ptr__,(string *)&o_2);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&o_2.super_gc_heap_ptr_untyped);
    std::__cxx11::wstring::~wstring((wstring *)&to_json_value);
    goto LAB_0014185f;
  case object:
    pgVar7 = &value::object_value(&v)->super_gc_heap_ptr_untyped;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&o.super_gc_heap_ptr_untyped,pgVar7);
    bVar4 = gc_heap_ptr_untyped::has_type<mjs::function_object>(&o.super_gc_heap_ptr_untyped);
    if (bVar4) {
      value::value(__return_storage_ptr__,(value *)&value::undefined);
    }
    else {
      bVar4 = is_array(&o);
      if (bVar4) {
        stringify_state::nest::nest((nest *)&to_json_value,(stringify_state *)this,&o);
        partial.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        partial.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        partial.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        puVar6 = (undefined8 *)gc_heap_ptr_untyped::get(&o.super_gc_heap_ptr_untyped);
        local_200.n_ = (double)L"length";
        local_208 = (undefined1  [8])0x6;
        (**(code **)*puVar6)(&o_2,puVar6);
        uVar5 = to_uint32((value *)&o_2);
        value::~value((value *)&o_2);
        uVar14 = extraout_RDX;
        for (uVar17 = 0; uVar5 != uVar17; uVar17 = uVar17 + 1) {
          index_string_abi_cxx11_((wstring *)local_208,(mjs *)(ulong)uVar17,(uint32_t)uVar14);
          wVar22._M_str = (wchar_t *)&o;
          wVar22._M_len = (size_t)local_208;
          json_str((value *)&o_2,this,
                   (stringify_state *)
                   local_200.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_,
                   wVar22,holder);
          std::__cxx11::wstring::~wstring((wstring *)local_208);
          if ((int)o_2.super_gc_heap_ptr_untyped.heap_ == 4) {
            psVar10 = value::string_value((value *)&o_2);
            std::vector<mjs::string,_std::allocator<mjs::string>_>::push_back(&partial,psVar10);
          }
          else {
            if ((int)o_2.super_gc_heap_ptr_untyped.heap_ != 0) {
              __assert_fail("str_p.type() == value_type::string",
                            "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/json_object.cpp"
                            ,0x288,
                            "string mjs::(anonymous namespace)::json_str_array(stringify_state &, const object_ptr &)"
                           );
            }
            stringify_state::null_str((stringify_state *)local_208);
            std::vector<mjs::string,_std::allocator<mjs::string>_>::emplace_back<mjs::string>
                      (&partial,(string *)local_208);
            gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_208);
          }
          value::~value((value *)&o_2);
          uVar14 = extraout_RDX_00;
        }
        if (partial.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
            super__Vector_impl_data._M_start ==
            partial.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          plVar9 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this);
          (**(code **)(*plVar9 + 0x98))(&local_150,plVar9,"[]");
        }
        else {
          o_2.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)local_220;
          o_2.super_gc_heap_ptr_untyped.pos_ = 0;
          o_2.super_gc_heap_ptr_untyped._12_4_ = 0;
          local_220._0_4_ = 0;
          std::__cxx11::wstring::push_back((wchar_t)&o_2);
          (anonymous_namespace)::stringify_state::nest::start_gap_abi_cxx11_
                    ((wstring *)local_208,&to_json_value);
          std::__cxx11::wstring::append((wstring *)&o_2);
          std::__cxx11::wstring::~wstring((wstring *)local_208);
          psVar2 = partial.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          bVar4 = true;
          for (psVar19 = partial.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>.
                         _M_impl.super__Vector_impl_data._M_start; psVar19 != psVar2;
              psVar19 = psVar19 + 1) {
            if (!bVar4) {
              (anonymous_namespace)::stringify_state::nest::sep_abi_cxx11_
                        ((wstring *)local_208,&to_json_value);
              std::__cxx11::wstring::append((wstring *)&o_2);
              std::__cxx11::wstring::~wstring((wstring *)local_208);
            }
            _local_208 = string::view(psVar19);
            std::__cxx11::wstring::append<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
                      ((wstring *)&o_2,
                       (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_208);
            bVar4 = false;
          }
          (anonymous_namespace)::stringify_state::nest::end_gap_abi_cxx11_
                    ((wstring *)local_208,&to_json_value);
          std::__cxx11::wstring::append((wstring *)&o_2);
          std::__cxx11::wstring::~wstring((wstring *)local_208);
          std::__cxx11::wstring::push_back((wchar_t)&o_2);
          local_200.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
               o_2.super_gc_heap_ptr_untyped.heap_;
          local_208 = (undefined1  [8])o_2.super_gc_heap_ptr_untyped._8_8_;
          string::string((string *)&local_150,*(gc_heap **)this,(wstring_view *)local_208);
          std::__cxx11::wstring::~wstring((wstring *)&o_2);
        }
        this_00 = &partial;
      }
      else {
        stringify_state::nest::nest((nest *)&to_json_value,(stringify_state *)this,&o);
        if (*(long *)(this + 0x30) == 0) {
          poVar8 = (object *)gc_heap_ptr_untyped::get(&o.super_gc_heap_ptr_untyped);
          object::own_property_names(&k,poVar8,true);
        }
        else {
          k.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          k.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          k.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pgVar11 = (gc_vector<mjs::gc_heap_ptr_untracked<mjs::gc_string,_true>_> *)
                    gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(this + 0x30));
          pgVar12 = gc_vector<mjs::gc_heap_ptr_untracked<mjs::gc_string,_true>_>::tab(pgVar11);
          pgVar11 = (gc_vector<mjs::gc_heap_ptr_untracked<mjs::gc_string,_true>_> *)
                    gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(this + 0x30));
          uVar5 = gc_vector<mjs::gc_heap_ptr_untracked<mjs::gc_string,_true>_>::length(pgVar11);
          pgVar16 = (gc_heap *)(pgVar12 + 1);
          uVar18 = (ulong)uVar5;
          while (bVar4 = uVar18 != 0, uVar18 = uVar18 - 1, bVar4) {
            gc_heap_ptr_untracked<mjs::gc_string,_true>::track
                      ((gc_heap_ptr_untracked<mjs::gc_string,_true> *)local_208,pgVar16);
            gc_heap_ptr_untyped::gc_heap_ptr_untyped
                      (&o_2.super_gc_heap_ptr_untyped,(gc_heap_ptr_untyped *)local_208);
            std::vector<mjs::string,_std::allocator<mjs::string>_>::emplace_back<mjs::string>
                      (&k,(string *)&o_2.super_gc_heap_ptr_untyped);
            gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&o_2.super_gc_heap_ptr_untyped);
            gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_208);
            pgVar16 = (gc_heap *)((long)&(pgVar16->pointers_).set_ + 4);
          }
        }
        partial_1.
        super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        partial_1.
        super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        partial_1.
        super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        psVar2 = k.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (psVar19 = k.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
                       super__Vector_impl_data._M_start; psVar19 != psVar2; psVar19 = psVar19 + 1) {
          wVar22 = string::view(psVar19);
          key_00._M_str = (wchar_t *)&o;
          key_00._M_len = (size_t)wVar22._M_str;
          json_str((value *)&o_2,this,(stringify_state *)wVar22._M_len,key_00,holder);
          if ((int)o_2.super_gc_heap_ptr_untyped.heap_ != 0) {
            if ((int)o_2.super_gc_heap_ptr_untyped.heap_ != 4) {
              __assert_fail("str_p.type() == value_type::string",
                            "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/json_object.cpp"
                            ,0x265,
                            "string mjs::(anonymous namespace)::json_str_object(stringify_state &, const object_ptr &)"
                           );
            }
            local_60 = string::view(psVar19);
            (anonymous_namespace)::json_quote_abi_cxx11_
                      ((wstring *)&to_json,(_anonymous_namespace_ *)&local_60,
                       (wstring_view *)local_60._M_str);
            std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                            *)&o_1,(wstring *)&to_json,L":");
            pwVar1 = L"function ";
            if (*(long *)(CONCAT44(to_json_value._4_4_,to_json_value.type_) + 0x68) == 0) {
              pwVar1 = L"\'\"\\\b\f\n\r\t";
            }
            std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                      ((wstring *)&local_d8,pwVar1 + 8,(allocator<wchar_t> *)&local_50);
            std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                            *)&partial,
                           (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                            *)&o_1,&local_d8);
            psVar10 = value::string_value((value *)&o_2);
            local_70 = string::view(psVar10);
            std::__cxx11::wstring::
            wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
                      ((wstring *)&local_50,&local_70,&local_1d9);
            std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                            *)local_208,
                           (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                            *)&partial,&local_50);
            std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>::
            emplace_back<std::__cxx11::wstring>
                      ((vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>> *)
                       &partial_1,
                       (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
                       )local_208);
            std::__cxx11::wstring::~wstring((wstring *)local_208);
            std::__cxx11::wstring::~wstring((wstring *)&local_50);
            std::__cxx11::wstring::~wstring((wstring *)&partial);
            std::__cxx11::wstring::~wstring((wstring *)&local_d8);
            std::__cxx11::wstring::~wstring((wstring *)&o_1);
            std::__cxx11::wstring::~wstring((wstring *)&to_json);
          }
          value::~value((value *)&o_2);
        }
        if (partial_1.
            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            partial_1.
            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          plVar9 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this);
          (**(code **)(*plVar9 + 0x98))(&local_150,plVar9,"{}");
        }
        else {
          o_2.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)local_220;
          o_2.super_gc_heap_ptr_untyped.pos_ = 0;
          o_2.super_gc_heap_ptr_untyped._12_4_ = 0;
          local_220._0_4_ = 0;
          std::__cxx11::wstring::push_back((wchar_t)&o_2);
          (anonymous_namespace)::stringify_state::nest::start_gap_abi_cxx11_
                    ((wstring *)local_208,&to_json_value);
          std::__cxx11::wstring::append((wstring *)&o_2);
          std::__cxx11::wstring::~wstring((wstring *)local_208);
          pbVar3 = partial_1.
                   super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          bVar4 = true;
          for (pbVar20 = partial_1.
                         super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; pbVar20 != pbVar3;
              pbVar20 = pbVar20 + 1) {
            if (!bVar4) {
              (anonymous_namespace)::stringify_state::nest::sep_abi_cxx11_
                        ((wstring *)local_208,&to_json_value);
              std::__cxx11::wstring::append((wstring *)&o_2);
              std::__cxx11::wstring::~wstring((wstring *)local_208);
            }
            std::__cxx11::wstring::append((wstring *)&o_2);
            bVar4 = false;
          }
          (anonymous_namespace)::stringify_state::nest::end_gap_abi_cxx11_
                    ((wstring *)local_208,&to_json_value);
          std::__cxx11::wstring::append((wstring *)&o_2);
          std::__cxx11::wstring::~wstring((wstring *)local_208);
          std::__cxx11::wstring::push_back((wchar_t)&o_2);
          local_200.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
               o_2.super_gc_heap_ptr_untyped.heap_;
          local_208 = (undefined1  [8])o_2.super_gc_heap_ptr_untyped._8_8_;
          string::string((string *)&local_150,*(gc_heap **)this,(wstring_view *)local_208);
          std::__cxx11::wstring::~wstring((wstring *)&o_2);
        }
        std::
        vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::~vector(&partial_1);
        this_00 = &k;
      }
      std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector(this_00);
      stringify_state::nest::~nest((nest *)&to_json_value);
      value::value(__return_storage_ptr__,(string *)&local_150);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_150);
    }
    this_01 = (value *)&o;
    goto LAB_0014185a;
  default:
    __assert_fail("v.type() == value_type::object",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/json_object.cpp"
                  ,0x2d0,
                  "value mjs::(anonymous namespace)::json_str(stringify_state &, const std::wstring_view, const object_ptr &)"
                 );
  }
  this_01 = &to_json_value;
LAB_0014185a:
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)this_01);
LAB_0014185f:
  value::~value(&v);
  return __return_storage_ptr__;
}

Assistant:

value json_str(stringify_state& state, const std::wstring_view key, const object_ptr& holder) {
    // ES5.1, 15.12.3 Str(key, holder)
    // May only return a string or undefined

    auto& h = state.heap();
    // 1. Let value be the result of calling the [[Get]] internal method of holder with argument key.
    auto v = holder->get(key);

    // 2. If Type(value) is Object, then
    if (v.type() == value_type::object) {        
        auto o = v.object_value();
        auto to_json_value = o->get(L"toJSON");
        if (to_json_value.type() == value_type::object) {
            if (auto to_json = to_json_value.object_value(); to_json.has_type<function_object>()) {
                v = call_function(to_json_value, v, {value{string{h,key}}});
            }
        }
    }

    // 3. If ReplacerFunction is not undefined, then
    state.call_replacer(v, key, holder);

    // 4. If Type(value) is Object then, 
    if (v.type() == value_type::object) {        
        if (auto o = v.object_value(); is_primitive_object(*o)) {
            v = o->internal_value();
        }
    }

    switch (v.type()) {
    case value_type::undefined:
        return value::undefined;
    case value_type::null:
        return value{state.null_str()};
    case value_type::boolean:
        return value{state.bool_str(v.boolean_value())};
    case value_type::number:
        if (!std::isfinite(v.number_value())) {
            return value{state.null_str()};
        } else {
            return value{to_string(h, v.number_value())};
        }
    case value_type::string:
        return value{string{h, json_quote(v.string_value().view())}};
    default:
        break;
    }
    assert(v.type() == value_type::object);
    const auto o = v.object_value();
    if (o.has_type<function_object>()) {
        return value::undefined;
    } else {
        return value{is_array(o) ? json_str_array(state, o) : json_str_object(state, o) };
    }
}